

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf-sequencing-algorithm.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  time_t tVar9;
  ostream *poVar10;
  int n;
  int n_00;
  char *pcVar11;
  long lVar12;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  initializer_list<args::EitherFlag> in_03;
  initializer_list<args::EitherFlag> in_04;
  initializer_list<args::EitherFlag> in_05;
  initializer_list<args::EitherFlag> in_06;
  initializer_list<args::EitherFlag> in_07;
  initializer_list<args::EitherFlag> in_08;
  initializer_list<args::EitherFlag> in_09;
  initializer_list<args::EitherFlag> in_10;
  initializer_list<args::EitherFlag> in_11;
  initializer_list<args::EitherFlag> in_12;
  initializer_list<args::EitherFlag> in_13;
  initializer_list<args::EitherFlag> in_14;
  initializer_list<args::EitherFlag> in_15;
  initializer_list<args::EitherFlag> in_16;
  initializer_list<args::EitherFlag> in_17;
  initializer_list<args::EitherFlag> in_18;
  initializer_list<args::EitherFlag> in_19;
  initializer_list<args::EitherFlag> in_20;
  initializer_list<args::EitherFlag> in_21;
  initializer_list<args::EitherFlag> in_22;
  initializer_list<args::EitherFlag> in_23;
  initializer_list<args::EitherFlag> in_24;
  initializer_list<args::EitherFlag> in_25;
  initializer_list<args::EitherFlag> in_26;
  initializer_list<args::EitherFlag> in_27;
  initializer_list<args::EitherFlag> in_28;
  initializer_list<args::EitherFlag> in_29;
  initializer_list<args::EitherFlag> in_30;
  initializer_list<args::EitherFlag> in_31;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  int local_24c4;
  int local_24c0;
  int local_24bc;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file2;
  int local_22d8;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _path;
  stringstream ss;
  undefined6 uStack_21de;
  string local_21d8 [8];
  undefined1 local_21d0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_21c8;
  EitherFlag local_21b8 [8];
  Collimator collimator;
  string s;
  set<int,_std::less<int>,_std::allocator<int>_> l;
  vector<double,_std::allocator<double>_> w;
  ValueFlag<double,_args::ValueReader<double>_> _prob_intensity;
  string file;
  string strategy;
  vector<double,_std::allocator<double>_> Zmin;
  vector<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>_>_>
  tabu_list_aper;
  vector<std::pair<std::pair<int,_imrt::Station_*>,_bool>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_bool>_>_>
  tabu_list_inten;
  _Vector_base<double,_std::allocator<double>_> local_1cd0;
  _Vector_base<double,_std::allocator<double>_> local_1cb8;
  _Vector_base<double,_std::allocator<double>_> local_1ca0;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> volumes;
  vector<double,_std::allocator<double>_> Zmax;
  string path;
  string file2;
  string local_1c18;
  string local_1bf8;
  Plan P;
  string local_1b08;
  string local_1ae8;
  string local_1ac8;
  ValueFlag<double,_args::ValueReader<double>_> _alpha;
  ValueFlag<double,_args::ValueReader<double>_> _temperature;
  ValueFlag<int,_args::ValueReader<int>_> _n;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1828;
  ValueFlag<double,_args::ValueReader<double>_> _alphaT;
  ArgumentParser parser;
  Group setup;
  ValueFlag<double,_args::ValueReader<double>_> _beta;
  Group dao_ls;
  ValueFlag<int,_args::ValueReader<int>_> _perturbation;
  Group accept;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _strategy;
  Flag ls_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _step_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _max_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _initial_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _open_apertures;
  ValueFlag<int,_args::ValueReader<int>_> _max_apertures;
  ValueFlag<int,_args::ValueReader<int>_> _seed;
  ValueFlag<int,_args::ValueReader<int>_> _maxtime;
  Flag accept_sa;
  Flag accept_best;
  Flag ls_aperture;
  Flag all_rand;
  Flag closed_max;
  Flag closed_min;
  Flag open_min;
  Flag open_max;
  ValueFlag<int,_args::ValueReader<int>_> _maxiter;
  ValueFlag<int,_args::ValueReader<int>_> _maxratio;
  ValueFlag<int,_args::ValueReader<int>_> _maxdelta;
  ValueFlag<int,_args::ValueReader<int>_> _vsize;
  ValueFlag<int,_args::ValueReader<int>_> _bsize;
  HelpFlag help;
  
  std::__cxx11::string::string((string *)&strategy,"dao_ls",(allocator *)&collimator);
  std::__cxx11::string::string
            ((string *)&file,"data/testinstance_0_70_140_210_280.txt",(allocator *)&collimator);
  std::__cxx11::string::string
            ((string *)&file2,"data/test_instance_coordinates.txt",(allocator *)&collimator);
  std::__cxx11::string::string((string *)&path,".",(allocator *)&collimator);
  tVar9 = time((time_t *)0x0);
  local_22d8 = (int)tVar9;
  tabu_list_inten.
  super__Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_bool>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tabu_list_inten.
  super__Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_bool>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tabu_list_inten.
  super__Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_bool>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tabu_list_aper.
  super__Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tabu_list_aper.
  super__Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tabu_list_aper.
  super__Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)&collimator,"********* IMRT-Solver (Aperture solver) *********",
             (allocator *)&_strategy);
  std::__cxx11::string::string
            ((string *)&ss,
             "Example.\n.../AS -s ibo_ls --maxiter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --bsize=5 --vsize=20 --max-apertures=4 --seed=0 --open-apertures=1 --initial-intensity=4 --step-intensity=1 --file-dep=data/Equidistantes/equidist00.txt --file-coord=data/Equidistantes/equidist-coord.txt"
             ,(allocator *)&_file);
  args::ArgumentParser::ArgumentParser(&parser,(string *)&collimator,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)&collimator);
  std::__cxx11::string::string((string *)&_strategy,"help",(allocator *)&_file2);
  std::__cxx11::string::string((string *)&_file,"Display this help menu",(allocator *)&_path);
  _ss = 0x6801;
  local_21d0 = (undefined1  [8])0x0;
  local_21c8._0_8_ = local_21c8._0_8_ & 0xffffffffffffff00;
  local_21d8 = (string  [8])&local_21c8;
  args::EitherFlag::EitherFlag(local_21b8,"help");
  in._M_len = 2;
  in._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in);
  args::HelpFlag::HelpFlag
            (&help,&parser.super_Group,(string *)&_strategy,(string *)&_file,(Matcher *)&collimator)
  ;
  args::Matcher::~Matcher((Matcher *)&collimator);
  lVar12 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(&ss + lVar12));
    lVar12 = lVar12 + -0x28;
  } while (lVar12 != -0x20);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::~string((string *)&_strategy);
  std::__cxx11::string::string((string *)&_file,"string",(allocator *)&_alpha);
  std::__cxx11::string::string((string *)&_file2,"Strategy  (dao_ls|ibo_ls)",(allocator *)&_beta);
  _ss = 0x7301;
  local_21d0 = (undefined1  [8])0x0;
  local_21c8._0_8_ = local_21c8._0_8_ & 0xffffffffffffff00;
  local_21d8 = (string  [8])&local_21c8;
  args::EitherFlag::EitherFlag(local_21b8,"strategy");
  in_00._M_len = 2;
  in_00._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_00);
  _path.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&_path.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  _path.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched = false;
  _path.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._9_7_ = 0;
  _path.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p._0_1_ =
       0;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(&_strategy,&parser.super_Group,(string *)&_file,(string *)&_file2,
              (Matcher *)&collimator,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,false);
  std::__cxx11::string::~string((string *)&_path);
  args::Matcher::~Matcher((Matcher *)&collimator);
  lVar12 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(&ss + lVar12));
    lVar12 = lVar12 + -0x28;
  } while (lVar12 != -0x20);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_prob_intensity);
  std::__cxx11::to_string((string *)&_alpha,0x14);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Number of considered beamlets for selection (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_alpha);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"bsize");
  in_01._M_len = 1;
  in_01._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_01);
  _beta.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_bsize,&parser.super_Group,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
             (int *)&_beta,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_alpha);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_prob_intensity);
  std::__cxx11::to_string((string *)&_alpha,0x32);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Number of considered worst voxels (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_alpha);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"vsize");
  in_02._M_len = 1;
  in_02._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_02);
  _beta.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_vsize,&parser.super_Group,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
             (int *)&_beta,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_alpha);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_prob_intensity);
  std::__cxx11::to_string((string *)&_alpha,5.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Max delta  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_alpha);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"maxdelta");
  in_03._M_len = 1;
  in_03._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_03);
  _beta.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_maxdelta,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(int *)&_beta,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_alpha);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_prob_intensity);
  std::__cxx11::to_string((string *)&_alpha,3.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Max ratio  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_alpha);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"maxratio");
  in_04._M_len = 1;
  in_04._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_04);
  _beta.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_maxratio,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(int *)&_beta,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_alpha);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"double",(allocator *)&_temperature);
  std::__cxx11::to_string((string *)&_beta,1.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Initial temperature for intensities  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_beta);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"alpha");
  in_05._M_len = 1;
  in_05._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_05);
  _prob_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&_alpha,&parser.super_Group,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
             (double *)&_prob_intensity,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_beta);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"double",(allocator *)&_alphaT);
  std::__cxx11::to_string((string *)&_prob_intensity,1.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Initial temperature for ratio  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_prob_intensity);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"beta");
  in_06._M_len = 1;
  in_06._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_06);
  _temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&_beta,&parser.super_Group,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
             (double *)&_temperature,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_prob_intensity);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_alphaT);
  std::__cxx11::to_string((string *)&_prob_intensity,5000);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Number of iterations (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_prob_intensity);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"maxiter");
  in_07._M_len = 1;
  in_07._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_07);
  _temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)_temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
       & 0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_maxiter,&parser.super_Group,(string *)&_file,(string *)&_file2,(Matcher *)&collimator
             ,(int *)&_temperature,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_prob_intensity);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_alphaT);
  std::__cxx11::to_string((string *)&_prob_intensity,0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Maximum time in seconds (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_prob_intensity);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"maxtime");
  in_08._M_len = 1;
  in_08._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_08);
  _temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)_temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
       & 0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_maxtime,&parser.super_Group,(string *)&_file,(string *)&_file2,(Matcher *)&collimator
             ,(int *)&_temperature,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_prob_intensity);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_alphaT);
  std::__cxx11::to_string((string *)&_prob_intensity,local_22d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Seed  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_prob_intensity);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"seed");
  in_09._M_len = 1;
  in_09._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_09);
  _temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)_temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
       & 0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_seed,&parser.super_Group,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
             (int *)&_temperature,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_prob_intensity);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string
            ((string *)&collimator,"Direct aperture local search:",(allocator *)&_file);
  local_21d8 = (string  [8])0x0;
  _ss = args::Group::Validators::DontCare;
  local_21c8._0_8_ =
       std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::_M_invoke;
  local_21d0 = (undefined1  [8])
               std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
               _M_manager;
  args::Group::Group(&dao_ls,&parser.super_Group,(string *)&collimator,
                     (function<bool_(const_args::Group_&)> *)&ss);
  std::_Function_base::~_Function_base((_Function_base *)&ss);
  std::__cxx11::string::~string((string *)&collimator);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_alphaT);
  local_24bc = 5;
  std::__cxx11::to_string((string *)&_prob_intensity,5);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Initial intensity for the station  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_prob_intensity);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"max-apertures");
  in_10._M_len = 1;
  in_10._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_10);
  _temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)_temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
       & 0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_max_apertures,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(int *)&_temperature,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_prob_intensity);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_alphaT);
  local_24c0 = -1;
  std::__cxx11::to_string((string *)&_prob_intensity,-1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Number of initialized open apertures (-1: all, default:",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_prob_intensity);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"open-apertures");
  in_11._M_len = 1;
  in_11._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_11);
  _temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)_temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
       & 0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_open_apertures,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(int *)&_temperature,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_prob_intensity);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_alphaT);
  std::__cxx11::to_string((string *)&_prob_intensity,2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Initial value aperture intensity  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_prob_intensity);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"initial-intensity");
  in_12._M_len = 1;
  in_12._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_12);
  _temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)_temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
       & 0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_initial_intensity,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(int *)&_temperature,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_prob_intensity);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_alphaT);
  local_24c4 = 0x1c;
  std::__cxx11::to_string((string *)&_prob_intensity,0x1c);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Max value aperture intensity  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_prob_intensity);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"max-intensity");
  in_13._M_len = 1;
  in_13._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_13);
  _temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)_temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
       & 0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_max_intensity,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(int *)&_temperature,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_prob_intensity);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&_alphaT);
  std::__cxx11::to_string((string *)&_prob_intensity,2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Step size for aperture intensity  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_prob_intensity);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"step-intensity");
  in_14._M_len = 1;
  in_14._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_14);
  _temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)_temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
       & 0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_step_intensity,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(int *)&_temperature,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_prob_intensity);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string
            ((string *)&collimator,
             "Initial solution setup (these override all provided configurations):",
             (allocator *)&_file);
  local_21d8 = (string  [8])0x0;
  _ss = args::Group::Validators::DontCare;
  local_21c8._0_8_ =
       std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::_M_invoke;
  local_21d0 = (undefined1  [8])
               std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
               _M_manager;
  args::Group::Group(&setup,&parser.super_Group,(string *)&collimator,
                     (function<bool_(const_args::Group_&)> *)&ss);
  std::_Function_base::~_Function_base((_Function_base *)&ss);
  std::__cxx11::string::~string((string *)&collimator);
  std::__cxx11::string::string((string *)&_file,"open_max",(allocator *)&_path);
  std::__cxx11::string::string
            ((string *)&_file2,"Open aperture setup with max intensity",
             (allocator *)&_prob_intensity);
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"open-max-setup");
  in_15._M_len = 1;
  in_15._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_15);
  args::Flag::Flag(&open_max,&setup,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,false)
  ;
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"open_min",(allocator *)&_path);
  std::__cxx11::string::string
            ((string *)&_file2,"Open aperture setup with min intensity",
             (allocator *)&_prob_intensity);
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"open-min-setup");
  in_16._M_len = 1;
  in_16._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_16);
  args::Flag::Flag(&open_min,&setup,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,false)
  ;
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"closed_min",(allocator *)&_path);
  std::__cxx11::string::string
            ((string *)&_file2,"Closed aperture setup with min intensity",
             (allocator *)&_prob_intensity);
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"closed-min-setup");
  in_17._M_len = 1;
  in_17._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_17);
  args::Flag::Flag(&closed_min,&setup,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
                   false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"closed_max",(allocator *)&_path);
  std::__cxx11::string::string
            ((string *)&_file2,"Closed aperture setup with max intensity",
             (allocator *)&_prob_intensity);
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"closed-max-setup");
  in_18._M_len = 1;
  in_18._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_18);
  args::Flag::Flag(&closed_max,&setup,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
                   false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"all_rand",(allocator *)&_path);
  std::__cxx11::string::string
            ((string *)&_file2,"Random aperture setup with random intensity",
             (allocator *)&_prob_intensity);
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"rand-setup");
  in_19._M_len = 1;
  in_19._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_19);
  args::Flag::Flag(&all_rand,&setup,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,false)
  ;
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"ls_apertures",(allocator *)&_path);
  std::__cxx11::string::string
            ((string *)&_file2,"Apply aperture local search",(allocator *)&_prob_intensity);
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"ls-aperture");
  in_20._M_len = 1;
  in_20._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_20);
  args::Flag::Flag(&ls_aperture,&dao_ls,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
                   false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"ls_intensity",(allocator *)&_path);
  std::__cxx11::string::string
            ((string *)&_file2,"Apply intensity local search",(allocator *)&_prob_intensity);
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"ls-intensity");
  in_21._M_len = 1;
  in_21._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_21);
  args::Flag::Flag(&ls_intensity,&dao_ls,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
                   false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"double",(allocator *)&_perturbation);
  std::__cxx11::to_string((string *)&_temperature,0.2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Probability to search over intensity  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_temperature)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"prob-intensity");
  in_22._M_len = 1;
  in_22._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_22);
  _alphaT.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&_prob_intensity,&dao_ls,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
             (double *)&_alphaT,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_temperature);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&collimator,"Acceptance criterion:",(allocator *)&_file);
  local_21d8 = (string  [8])0x0;
  _ss = args::Group::Validators::AtMostOne;
  local_21c8._0_8_ =
       std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::_M_invoke;
  local_21d0 = (undefined1  [8])
               std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
               _M_manager;
  args::Group::Group(&accept,&parser.super_Group,(string *)&collimator,
                     (function<bool_(const_args::Group_&)> *)&ss);
  std::_Function_base::~_Function_base((_Function_base *)&ss);
  std::__cxx11::string::~string((string *)&collimator);
  std::__cxx11::string::string((string *)&_file,"accept-best",(allocator *)&_path);
  std::__cxx11::string::string
            ((string *)&_file2,"Accept only improvement",(allocator *)&_temperature);
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"accept-best");
  in_23._M_len = 1;
  in_23._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_23);
  args::Flag::Flag(&accept_best,&accept,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
                   false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"accept-sa",(allocator *)&_path);
  std::__cxx11::string::string
            ((string *)&_file2,"Accept as simulated annealing",(allocator *)&_temperature);
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"accept-sa");
  in_24._M_len = 1;
  in_24._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_24);
  args::Flag::Flag(&accept_sa,&accept,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
                   false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_file);
  dVar1 = (double)std::__cxx11::string::string((string *)&_file,"double",(allocator *)&_n);
  std::__cxx11::to_string((string *)&_alphaT,dVar1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Temperature for acceptance criterion  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_alphaT);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"temperature");
  in_25._M_len = 1;
  in_25._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_25);
  _perturbation.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&_temperature,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(double *)&_perturbation,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_alphaT);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"double",(allocator *)&P);
  std::__cxx11::to_string((string *)&_perturbation,0.95);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Reduction rate of the temperature  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_perturbation
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"alphaT");
  in_26._M_len = 1;
  in_26._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_26);
  _n.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base = (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&_alphaT,&parser.super_Group,(string *)&_file,(string *)&_file2,(Matcher *)&collimator,
             (double *)&_n,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_perturbation);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file,"int",(allocator *)&l);
  std::__cxx11::to_string((string *)&_n,2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 "Perturbation size  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_n);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_file2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"perturbation-size");
  in_27._M_len = 1;
  in_27._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_27);
  P._vptr_Plan = (_func_int **)((ulong)P._vptr_Plan._4_4_ << 0x20);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_perturbation,&parser.super_Group,(string *)&_file,(string *)&_file2,
             (Matcher *)&collimator,(int *)&P,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_n);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::string((string *)&_file2,"string",(allocator *)&P);
  std::__cxx11::string::string((string *)&_path,"File with the deposition matrix",(allocator *)&l);
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"file-dep");
  in_28._M_len = 1;
  in_28._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_28);
  _n.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&_n.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  _n.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched = false;
  _n.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._9_7_ = 0;
  _n.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p._0_1_ = 0;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(&_file,&parser.super_Group,(string *)&_file2,(string *)&_path,(Matcher *)&collimator,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_n,false);
  std::__cxx11::string::~string((string *)&_n);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_path,"string",(allocator *)&l);
  std::__cxx11::string::string((string *)&_n,"File with the beam coordinates",(allocator *)&s);
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"file-coord");
  in_29._M_len = 1;
  in_29._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_29);
  P._vptr_Plan = (_func_int **)&P.angle2station._M_t._M_impl.super__Rb_tree_header;
  P.angle2station._M_t._M_impl._0_8_ = 0;
  P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(&_file2,&parser.super_Group,(string *)&_path,(string *)&_n,(Matcher *)&collimator,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&P,false);
  std::__cxx11::string::~string((string *)&P);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&_n);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::string((string *)&_path,"int",(allocator *)&s);
  std::__cxx11::string::string((string *)&P,"Number of instance",(allocator *)&w);
  _ss = 0x6e01;
  local_21d0 = (undefined1  [8])0x0;
  local_21c8._0_8_ = local_21c8._0_8_ & 0xffffffffffffff00;
  in_30._M_len = 1;
  in_30._M_array = (iterator)&ss;
  local_21d8 = (string  [8])&local_21c8;
  args::Matcher::Matcher((Matcher *)&collimator,in_30);
  l._M_t._M_impl._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_n,&parser.super_Group,(string *)&_path,(string *)&P,(Matcher *)&collimator,(int *)&l,
             false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&P);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::string((string *)&P,"string",(allocator *)&w);
  std::__cxx11::string::string
            ((string *)&l,"Absolute path of the executable (if it is executed from other directory)"
             ,(allocator *)&Zmin);
  args::EitherFlag::EitherFlag((EitherFlag *)&ss,"path");
  in_31._M_len = 1;
  in_31._M_array = (iterator)&ss;
  args::Matcher::Matcher((Matcher *)&collimator,in_31);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(&_path,&parser.super_Group,(string *)&P,(string *)&l,(Matcher *)&collimator,&s,false);
  std::__cxx11::string::~string((string *)&s);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string(local_21d8);
  std::__cxx11::string::~string((string *)&l);
  std::__cxx11::string::~string((string *)&P);
  args::ArgumentParser::ParseCLI(&parser,argc,argv);
  iVar3 = (*_strategy.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])()
  ;
  if ((char)iVar3 != '\0') {
    std::__cxx11::string::_M_assign((string *)&strategy);
  }
  (*_bsize.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (*_vsize.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (*_maxdelta.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (*_maxratio.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (*_alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (**(code **)(CONCAT44(_beta.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                        _vptr_Base._4_4_,
                        _beta.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                        _vptr_Base._0_4_) + 0x10))();
  (*_maxiter.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  iVar4 = (*_maxtime.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  iVar3 = 0;
  if ((char)iVar4 != '\0') {
    iVar3 = _maxtime.value;
  }
  iVar4 = (*_max_apertures.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
            [2])();
  if ((char)iVar4 != '\0') {
    local_24bc = _max_apertures.value;
  }
  iVar4 = (*_open_apertures.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
            [2])();
  if ((char)iVar4 != '\0') {
    local_24c0 = _open_apertures.value;
  }
  iVar4 = (*_seed.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar4 != '\0') {
    local_22d8 = _seed.value;
  }
  iVar5 = (*_initial_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
            _vptr_Base[2])();
  iVar4 = 2;
  if ((char)iVar5 != '\0') {
    iVar4 = _initial_intensity.value;
  }
  iVar5 = (*_max_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
            [2])();
  if ((char)iVar5 != '\0') {
    local_24c4 = _max_intensity.value;
  }
  iVar6 = (*_step_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
            [2])();
  iVar5 = 2;
  if ((char)iVar6 != '\0') {
    iVar5 = _step_intensity.value;
  }
  (*_prob_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (*_temperature.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (*_alphaT.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (*ls_aperture.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])(&ls_aperture);
  (*ls_intensity.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  iVar6 = (*ls_aperture.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])(&ls_aperture);
  if ((char)iVar6 == '\0') {
    (*ls_intensity.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  }
  (*accept_sa.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (*accept_best.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (*_perturbation.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  iVar7 = (*_n.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  iVar6 = 0;
  if ((char)iVar7 != '\0') {
    iVar6 = _n.value;
  }
  iVar7 = (*open_max.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar7 == '\0') {
    iVar7 = (*open_min.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
    if ((char)iVar7 == '\0') {
      iVar7 = (*closed_min.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
      if ((char)iVar7 == '\0') {
        iVar7 = (*closed_max.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
        if ((char)iVar7 == '\0') {
          iVar7 = (*all_rand.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
          iVar7 = (uint)(byte)((byte)iVar7 ^ 1) * 2 + 4;
        }
        else {
          iVar7 = 3;
          iVar4 = local_24c4;
        }
      }
      else {
        iVar7 = 2;
        iVar4 = 0;
      }
    }
    else {
      iVar7 = 0;
      iVar4 = 0;
    }
  }
  else {
    iVar7 = 1;
    iVar4 = local_24c4;
  }
  iVar8 = (*_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar8 != '\0') {
    std::__cxx11::string::_M_assign((string *)&file);
  }
  iVar8 = (*_file2.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar8 != '\0') {
    std::__cxx11::string::_M_assign((string *)&file2);
  }
  iVar8 = (*_path.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar8 != '\0') {
    std::__cxx11::string::_M_assign((string *)&path);
  }
  chdir(path._M_dataplus._M_p);
  poVar10 = std::operator<<((ostream *)&std::cout,
                            "##**************************************************************************"
                           );
  std::endl<char,std::char_traits<char>>(poVar10);
  poVar10 = std::operator<<((ostream *)&std::cout,
                            "##**************************************************************************"
                           );
  std::endl<char,std::char_traits<char>>(poVar10);
  bVar2 = std::operator==(&strategy,"dao_ls");
  if (bVar2) {
    pcVar11 = "##******** IMRT-Solver (Direct Aperture Optimization Local Search) *********";
  }
  else {
    bVar2 = std::operator==(&strategy,"ibo_ls");
    if (!bVar2) goto LAB_001086d6;
    pcVar11 = "##******** IMRT-Solver (Intensity-based Optimization Local Search) *********";
  }
  poVar10 = std::operator<<((ostream *)&std::cout,pcVar11);
  std::endl<char,std::char_traits<char>>(poVar10);
LAB_001086d6:
  poVar10 = std::operator<<((ostream *)&std::cout,
                            "##**************************************************************************"
                           );
  std::endl<char,std::char_traits<char>>(poVar10);
  poVar10 = std::operator<<((ostream *)&std::cout,
                            "##**************************************************************************"
                           );
  std::endl<char,std::char_traits<char>>(poVar10);
  collimator.beam_coord._M_t._M_impl._0_8_ = 0x3ff0000000000000;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3ff00000;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x3ff0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&collimator;
  std::vector<double,_std::allocator<double>_>::vector(&w,__l,(allocator_type *)&ss);
  collimator.beam_coord._M_t._M_impl._0_8_ = 0;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x4053000000000000;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&collimator;
  std::vector<double,_std::allocator<double>_>::vector(&Zmin,__l_00,(allocator_type *)&ss);
  collimator.beam_coord._M_t._M_impl._0_8_ = 0x4050400000000000;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x404e0000;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x408f400000000000;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&collimator;
  std::vector<double,_std::allocator<double>_>::vector(&Zmax,__l_01,(allocator_type *)&ss);
  std::__cxx11::string::string((string *)&local_1ac8,(string *)&file2);
  std::__cxx11::string::string((string *)&local_1ae8,(string *)&file);
  get_angles((set<int,_std::less<int>,_std::allocator<int>_> *)&local_1828,&local_1ae8,n);
  imrt::Collimator::Collimator
            (&collimator,&local_1ac8,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_1828);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1828);
  std::__cxx11::string::~string((string *)&local_1ae8);
  std::__cxx11::string::~string((string *)&local_1ac8);
  std::__cxx11::string::string((string *)&local_1b08,(string *)&file);
  createVolumes(&volumes,&local_1b08,&collimator);
  std::__cxx11::string::~string((string *)&local_1b08);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_1ca0,&w);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_1cb8,&Zmin);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_1cd0,&Zmax);
  imrt::Plan::Plan(&P,(vector<double,_std::allocator<double>_> *)&local_1ca0,
                   (vector<double,_std::allocator<double>_> *)&local_1cb8,
                   (vector<double,_std::allocator<double>_> *)&local_1cd0,&collimator,&volumes,
                   local_24bc,local_24c4,iVar4,iVar5,local_24c0,iVar7,(char *)0x0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1cd0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1cb8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1ca0);
  std::__cxx11::string::string
            ((string *)&local_1bf8,"data/Equidistantes/optimalSolutions.txt",(allocator *)&ss);
  imrt::Plan::writeIntensities(&P,&local_1bf8,iVar6);
  std::__cxx11::string::~string((string *)&local_1bf8);
  imrt::Plan::printIntensity(&P,0);
  imrt::Plan::printIntensity(&P,1);
  imrt::Plan::printIntensity(&P,2);
  imrt::Plan::printIntensity(&P,3);
  imrt::Plan::printIntensity(&P,4);
  dVar1 = imrt::Plan::eval(&P);
  poVar10 = std::ostream::_M_insert<double>(dVar1);
  std::endl<char,std::char_traits<char>>(poVar10);
  imrt::EvaluationFunction::generate_voxel_dose_functions(P.ev);
  std::__cxx11::string::string((string *)&local_1c18,(string *)&file);
  get_angles(&l,&local_1c18,n_00);
  std::__cxx11::string::~string((string *)&local_1c18);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar10 = std::operator<<((ostream *)local_21d0,"python plotter/plot.py ");
  poVar10 = (ostream *)
            std::ostream::operator<<
                      ((ostream *)poVar10,
                       (int)l._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color / 5);
  poVar10 = std::operator<<(poVar10,"_");
  poVar10 = std::operator<<(poVar10,(string *)&strategy);
  poVar10 = std::operator<<(poVar10,"_");
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar4);
  poVar10 = std::operator<<(poVar10,"_");
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar7);
  poVar10 = std::operator<<(poVar10,"_");
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar3);
  poVar10 = std::operator<<(poVar10,"_");
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,local_22d8);
  std::operator<<(poVar10,".pdf");
  std::__cxx11::stringbuf::str();
  system(s._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&l._M_t);
  imrt::Plan::~Plan(&P);
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::~vector(&volumes);
  imrt::Collimator::~Collimator(&collimator);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Zmax.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Zmin.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&w.super__Vector_base<double,_std::allocator<double>_>);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag(&_path);
  args::FlagBase::~FlagBase((FlagBase *)&_n);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag(&_file2);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag(&_file);
  args::FlagBase::~FlagBase((FlagBase *)&_perturbation);
  args::FlagBase::~FlagBase((FlagBase *)&_alphaT);
  args::FlagBase::~FlagBase((FlagBase *)&_temperature);
  args::FlagBase::~FlagBase(&accept_sa.super_FlagBase);
  args::FlagBase::~FlagBase(&accept_best.super_FlagBase);
  args::Group::~Group(&accept);
  args::FlagBase::~FlagBase((FlagBase *)&_prob_intensity);
  args::FlagBase::~FlagBase(&ls_intensity.super_FlagBase);
  args::FlagBase::~FlagBase(&ls_aperture.super_FlagBase);
  args::FlagBase::~FlagBase(&all_rand.super_FlagBase);
  args::FlagBase::~FlagBase(&closed_max.super_FlagBase);
  args::FlagBase::~FlagBase(&closed_min.super_FlagBase);
  args::FlagBase::~FlagBase(&open_min.super_FlagBase);
  args::FlagBase::~FlagBase(&open_max.super_FlagBase);
  args::Group::~Group(&setup);
  args::FlagBase::~FlagBase((FlagBase *)&_step_intensity);
  args::FlagBase::~FlagBase((FlagBase *)&_max_intensity);
  args::FlagBase::~FlagBase((FlagBase *)&_initial_intensity);
  args::FlagBase::~FlagBase((FlagBase *)&_open_apertures);
  args::FlagBase::~FlagBase((FlagBase *)&_max_apertures);
  args::Group::~Group(&dao_ls);
  args::FlagBase::~FlagBase((FlagBase *)&_seed);
  args::FlagBase::~FlagBase((FlagBase *)&_maxtime);
  args::FlagBase::~FlagBase((FlagBase *)&_maxiter);
  args::FlagBase::~FlagBase((FlagBase *)&_beta);
  args::FlagBase::~FlagBase((FlagBase *)&_alpha);
  args::FlagBase::~FlagBase((FlagBase *)&_maxratio);
  args::FlagBase::~FlagBase((FlagBase *)&_maxdelta);
  args::FlagBase::~FlagBase((FlagBase *)&_vsize);
  args::FlagBase::~FlagBase((FlagBase *)&_bsize);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag(&_strategy);
  args::FlagBase::~FlagBase((FlagBase *)&help);
  args::ArgumentParser::~ArgumentParser(&parser);
  std::
  _Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>_>_>
  ::~_Vector_base(&tabu_list_aper.
                   super__Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>_>_>
                 );
  std::
  _Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_bool>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_bool>_>_>
  ::~_Vector_base(&tabu_list_inten.
                   super__Vector_base<std::pair<std::pair<int,_imrt::Station_*>,_bool>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_bool>_>_>
                 );
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::~string((string *)&file2);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&strategy);
  return 0;
}

Assistant:

int main(int argc, char** argv){

  int vsize=50;
  int bsize=20;
  int maxiter=5000;
  int maxtime=0;
  int max_apertures=5;
  int open_apertures=-1;
  double alpha=1.0;
  double beta=1.0;
  double maxdelta=5.0;
  double maxratio=3.0;
  bool search_aperture=false;
  bool search_intensity=false;
  string strategy="dao_ls";
  int n=0;

  int initial_intensity=2;
  int max_intensity=28;
  int step_intensity=2;
  bool acceptance=ILS::ACCEPT_NONE;
  int initial_setup;

  // ls params
  double prob_intensity=0.2;
  double temperature, initial_temperature=10;
  double min_temperature=0;
  double alphaT=0.95;
  int perturbation=2;

  string file="data/testinstance_0_70_140_210_280.txt";
  string file2="data/test_instance_coordinates.txt";

  string path=".";

  int seed=time(NULL);

  // Tabu list <<beam,station*>, open> for intensity
  vector<pair<pair<int,Station*>,  bool > > tabu_list_inten;
  // Tabu list <<beam,station*>, <aperture,open>> for aperture
  vector<pair<pair<int,Station*>, pair<int, bool> > > tabu_list_aper;
  int tabusize=10;


	args::ArgumentParser parser("********* IMRT-Solver (Aperture solver) *********", "Example.\n.../AS -s ibo_ls --maxiter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --bsize=5 --vsize=20 --max-apertures=4 --seed=0 --open-apertures=1 --initial-intensity=4 --step-intensity=1 --file-dep=data/Equidistantes/equidist00.txt --file-coord=data/Equidistantes/equidist-coord.txt");
	args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
	//args::ValueFlag<string> _format(parser, "string", "Format: (BR, BRw, 1C)", {'f'});
  args::ValueFlag<string> _strategy(parser, "string", "Strategy  (dao_ls|ibo_ls)", {'s', "strategy"});
	args::ValueFlag<int> _bsize(parser, "int", "Number of considered beamlets for selection ("+to_string(bsize)+")", {"bsize"});
	args::ValueFlag<int> _vsize(parser, "int", "Number of considered worst voxels ("+to_string(vsize)+")", {"vsize"});
 // args::ValueFlag<int> _int0(parser, "int", "Initial intensity for beams  ("+to_string(int0)+")", {"int0"});
  args::ValueFlag<int> _maxdelta(parser, "int", "Max delta  ("+to_string(maxdelta)+")", {"maxdelta"});
  args::ValueFlag<int> _maxratio(parser, "int", "Max ratio  ("+to_string(maxratio)+")", {"maxratio"});
  args::ValueFlag<double> _alpha(parser, "double", "Initial temperature for intensities  ("+to_string(alpha)+")", {"alpha"});
  args::ValueFlag<double> _beta(parser, "double", "Initial temperature for ratio  ("+to_string(beta)+")", {"beta"});
  args::ValueFlag<int> _maxiter(parser, "int", "Number of iterations ("+to_string(maxiter)+")", {"maxiter"});
  args::ValueFlag<int> _maxtime(parser, "int", "Maximum time in seconds ("+to_string(maxtime)+")", {"maxtime"});
  args::ValueFlag<int> _seed(parser, "int", "Seed  ("+to_string(seed)+")", {"seed"});

  args::Group dao_ls (parser, "Direct aperture local search:", args::Group::Validators::DontCare);
  args::ValueFlag<int> _max_apertures(parser, "int", "Initial intensity for the station  ("+to_string(max_apertures)+")", {"max-apertures"});
  args::ValueFlag<int> _open_apertures(parser, "int", "Number of initialized open apertures (-1: all, default:"+to_string(open_apertures)+")", {"open-apertures"});
  args::ValueFlag<int> _initial_intensity(parser, "int", "Initial value aperture intensity  ("+to_string(initial_intensity)+")", {"initial-intensity"});
  args::ValueFlag<int> _max_intensity(parser, "int", "Max value aperture intensity  ("+to_string(max_intensity)+")", {"max-intensity"});
  args::ValueFlag<int> _step_intensity(parser, "int", "Step size for aperture intensity  ("+to_string(step_intensity)+")", {"step-intensity"});

  args::Group setup (parser, "Initial solution setup (these override all provided configurations):", args::Group::Validators::DontCare);
  args::Flag open_max(setup, "open_max", "Open aperture setup with max intensity", {"open-max-setup"});
  args::Flag open_min(setup, "open_min", "Open aperture setup with min intensity", {"open-min-setup"});
  args::Flag closed_min(setup, "closed_min", "Closed aperture setup with min intensity", {"closed-min-setup"});
  args::Flag closed_max(setup, "closed_max", "Closed aperture setup with max intensity", {"closed-max-setup"});
  args::Flag all_rand(setup, "all_rand", "Random aperture setup with random intensity", {"rand-setup"});

  args::Flag ls_aperture(dao_ls, "ls_apertures", "Apply aperture local search", {"ls-aperture"});
  args::Flag ls_intensity(dao_ls, "ls_intensity", "Apply intensity local search", {"ls-intensity"});
  args::ValueFlag<double> _prob_intensity(dao_ls, "double", "Probability to search over intensity  ("+to_string(prob_intensity)+")", {"prob-intensity"});

  args::Group accept (parser, "Acceptance criterion:", args::Group::Validators::AtMostOne);
  args::Flag accept_best(accept, "accept-best", "Accept only improvement", {"accept-best"});
  args::Flag accept_sa(accept, "accept-sa", "Accept as simulated annealing", {"accept-sa"});

  args::ValueFlag<double> _temperature(parser, "double", "Temperature for acceptance criterion  ("+to_string(temperature)+")", {"temperature"});
  args::ValueFlag<double> _alphaT(parser, "double", "Reduction rate of the temperature  ("+to_string(alphaT)+")", {"alphaT"});
  args::ValueFlag<int> _perturbation(parser, "int", "Perturbation size  ("+to_string(perturbation)+")", {"perturbation-size"});
	//args::Flag trace(parser, "trace", "Trace", {"trace"});
  args::ValueFlag<string> _file(parser, "string", "File with the deposition matrix", {"file-dep"});
  args::ValueFlag<string> _file2(parser, "string", "File with the beam coordinates", {"file-coord"});
  args::ValueFlag<int> _n(parser, "int", "Number of instance", {'n'});

  args::ValueFlag<string> _path(parser, "string", "Absolute path of the executable (if it is executed from other directory)", {"path"});

	try
	{
		parser.ParseCLI(argc, argv);

	}
	catch (args::Help&)
	{
		std::cout << parser;
		return 0;
	}
	catch (args::ParseError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}
	catch (args::ValidationError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}

  if(_strategy) strategy=_strategy.Get();
  if(_bsize) bsize=_bsize.Get();
  if(_vsize) vsize=_vsize.Get();
  if(_maxdelta) maxdelta=_maxdelta.Get();
  if(_maxratio) maxratio=_maxratio.Get();
  if(_alpha) alpha=_alpha.Get();
  if(_beta) beta=_beta.Get();
  if(_maxiter) maxiter=_maxiter.Get();
  if(_maxtime) maxtime=_maxtime.Get();
  if(_max_apertures) max_apertures=_max_apertures.Get();
  if(_open_apertures) open_apertures=_open_apertures.Get();
  if(_seed) seed=_seed.Get();
  if(_initial_intensity) initial_intensity=_initial_intensity.Get();
  if(_max_intensity) max_intensity=_max_intensity.Get();
  if(_step_intensity) step_intensity=_step_intensity.Get();
  if(_prob_intensity) prob_intensity=_prob_intensity.Get();
  if(_temperature) temperature=initial_temperature=_temperature.Get();
  if(_alphaT) alphaT=_alphaT.Get();
  if (ls_aperture) search_aperture=true;
  if (ls_intensity) search_intensity=true;
  if(!ls_aperture && !ls_intensity){
    search_aperture=true;
    search_intensity=true;
  }
  if (accept_sa) acceptance=ILS::ACCEPT_SA;
  if (accept_best) acceptance=ILS::ACCEPT_NONE;
  if (_perturbation) perturbation=_perturbation.Get();
  if (_n) n=_n.Get();

  //This should be at the end given that will modify values
  if(open_max) {
    initial_setup=Station::OPEN_MAX_SETUP;
    initial_intensity=max_intensity;
  } else if (open_min) {
    initial_setup=Station::OPEN_MIN_SETUP;
    initial_intensity=0;
  } else if (closed_min) {
    initial_setup=Station::CLOSED_MIN_SETUP;
    initial_intensity=0;
  } else if (closed_max) {
    initial_setup=Station::CLOSED_MAX_SETUP;
    initial_intensity=max_intensity;
  } else if (all_rand) {
    initial_setup=Station::RAND_RAND_SETUP;
 }  else {
    initial_setup=Station::MANUAL_SETUP;
 }
  if (_file) file=_file.Get();
  if (_file2) file2=_file2.Get();
  if (_path) path=_path.Get();

  chdir(path.c_str());

  cout << "##**************************************************************************"<< endl;
  cout << "##**************************************************************************"<< endl;
  if(strategy=="dao_ls")
    cout << "##******** IMRT-Solver (Direct Aperture Optimization Local Search) *********"<< endl;
  else if(strategy=="ibo_ls")
    cout << "##******** IMRT-Solver (Intensity-based Optimization Local Search) *********"<< endl;
  cout << "##**************************************************************************"<< endl;
  cout << "##**************************************************************************"<< endl;

  vector<double> w={1,1,1};
  vector<double> Zmin={0,0,76};
  vector<double> Zmax={65,60,1000};

  Collimator collimator(file2, get_angles(file, 5));
  vector<Volume> volumes= createVolumes (file, collimator);

  Plan P(w, Zmin, Zmax, collimator, volumes, max_apertures, max_intensity, initial_intensity, step_intensity, open_apertures, initial_setup);

  P.writeIntensities("data/Equidistantes/optimalSolutions.txt",n);

  P.printIntensity(0);

  P.printIntensity(1);

  P.printIntensity(2);

  P.printIntensity(3);

  P.printIntensity(4);

  cout << P.eval() << endl;
  P.getEvaluationFunction()->generate_voxel_dose_functions ();
  set<int> l = get_angles(file, 5);

    std::stringstream ss;
    ss << "python plotter/plot.py " << *l.begin()/5 << "_" << strategy << "_" << initial_intensity << "_" << initial_setup << "_" << maxtime << "_" << seed <<".pdf";
    std::string s = ss.str();
    system(s.c_str());


  return 0;

}